

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Schema __thiscall capnp::SchemaLoader::loadOnce(SchemaLoader *this,Reader *reader)

{
  RawSchema *pRVar1;
  uint64_t typeId;
  TryGetResult TVar2;
  Locked<kj::Own<capnp::SchemaLoader::Impl>_> locked;
  Locked<kj::Own<capnp::SchemaLoader::Impl>_> local_28;
  
  typeId = 0;
  kj::_::Mutex::lock((Mutex *)this,EXCLUSIVE);
  local_28.ptr = &(this->impl).value;
  if (0x3f < (reader->_reader).dataSize) {
    typeId = *(reader->_reader).data;
  }
  local_28.mutex = (Mutex *)this;
  TVar2 = Impl::tryGet((this->impl).value.ptr,typeId);
  pRVar1 = TVar2.schema;
  if ((pRVar1 == (RawSchema *)0x0) || (pRVar1->lazyInitializer != (Initializer *)0x0)) {
    pRVar1 = Impl::load((this->impl).value.ptr,reader,false);
  }
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::~Locked(&local_28);
  return (Schema)&pRVar1->defaultBrand;
}

Assistant:

Schema SchemaLoader::loadOnce(const schema::Node::Reader& reader) const {
  auto locked = impl.lockExclusive();
  auto getResult = locked->get()->tryGet(reader.getId());
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // Doesn't exist yet, or the existing schema is a placeholder and therefore has not yet been
    // seen publicly.  Go ahead and load the incoming reader.
    return Schema(&locked->get()->load(reader, false)->defaultBrand);
  } else {
    return Schema(&getResult.schema->defaultBrand);
  }
}